

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

int __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::init(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *this,EVP_PKEY_CTX *ctx)

{
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  SPxStatus SVar2;
  int iVar3;
  Type TVar4;
  Representation RVar5;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *unaff_retaddr;
  SPxException *anon_var_0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000002e0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000400;
  undefined4 in_stack_fffffffffffffcd8;
  SPxStatus in_stack_fffffffffffffcdc;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffce0;
  cpp_dec_float<100U,_int,_void> *this_00;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffce8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffcf0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffcf8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd30;
  element_type local_2c0;
  _func_int **in_stack_fffffffffffffd90;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffd98;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffde0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe18;
  DataKey *local_180;
  undefined1 local_178 [80];
  undefined1 local_128 [104];
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c0;
  undefined1 *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff90;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffa0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  Desc *in_stack_ffffffffffffffc8;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffd0;
  
  local_c0 = this;
  if ((this->initialized & 1U) == 0) {
    this->initialized = true;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x88])();
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x79])();
    SVar2 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::status(&this->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    );
    if ((SVar2 < SINGULAR) ||
       (pSVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::solver(&this->
                           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ), pSVar6 != this)) {
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::load((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
             SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0));
    }
    this->initialized = false;
  }
  if (((this->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).matrixIsSetup & 1U) == 0) {
    in_stack_fffffffffffffd30 =
         (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)&this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::desc(&this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          );
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::loadDesc(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  SVar2 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::status(&this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  );
  pSVar6 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)(ulong)(uint)SVar2;
  if (SVar2 != SINGULAR) {
    iVar3 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x4d74bd);
    if (iVar3 == 0) {
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).factorized = true;
    }
    if (((this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).factorized & 1U) == 0) {
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::factorize(unaff_retaddr);
    }
    this->m_numCycle = 0;
    TVar4 = type(this);
    if (TVar4 == ENTER) {
      RVar5 = rep(this);
      if (RVar5 == COLUMN) {
        setPrimalBounds(in_stack_fffffffffffffcf0);
        setBasisStatus(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
      }
      else {
        setDualRowBounds(in_stack_fffffffffffffd30);
        setBasisStatus(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
      }
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x8d])();
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x7c])();
      dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x4d7613);
      DIdxSet::setMax((DIdxSet *)in_stack_fffffffffffffcf0,
                      (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
      coDim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x4d7637);
      DIdxSet::setMax((DIdxSet *)in_stack_fffffffffffffcf0,
                      (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
      dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x4d765b);
      DataArray<int>::reSize((DataArray<int> *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
      coDim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x4d767f);
      DataArray<int>::reSize((DataArray<int> *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
      pSVar1 = this->theratiotester;
      entertol(in_stack_fffffffffffffcf8);
      (*pSVar1->_vptr_SPxRatioTester[4])(pSVar1,local_128);
    }
    else {
      RVar5 = rep(this);
      if (RVar5 == ROW) {
        setPrimalBounds(in_stack_fffffffffffffcf0);
        setBasisStatus(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
      }
      else {
        setDualColBounds(in_stack_fffffffffffffde0);
        setBasisStatus(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
      }
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x8e])();
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x7d])();
      in_stack_fffffffffffffcf0 =
           (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)&this->infeasibilities;
      dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x4d7738);
      DIdxSet::setMax((DIdxSet *)in_stack_fffffffffffffcf0,
                      (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
      in_stack_fffffffffffffcf8 =
           (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)&this->isInfeasible;
      dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x4d775c);
      DataArray<int>::reSize((DataArray<int> *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
      pSVar1 = this->theratiotester;
      leavetol(in_stack_fffffffffffffcf8);
      (*pSVar1->_vptr_SPxRatioTester[4])(pSVar1,local_178);
    }
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::coSolve((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffffcf0,
              (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffffce8,
              (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffffce0);
    computePvec(in_stack_fffffffffffffd30);
    computeFrhs(in_stack_fffffffffffffe18);
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::solve((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)in_stack_fffffffffffffcf0,
            (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)in_stack_fffffffffffffce8,
            (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)in_stack_fffffffffffffce0);
    local_180 = (DataKey *)0x0;
    local_90 = &this->theShift;
    local_98 = (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&stack0xfffffffffffffe80;
    local_88 = local_98;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              (in_stack_fffffffffffffd98,(double)in_stack_fffffffffffffd90);
    TVar4 = type(this);
    if (TVar4 == ENTER) {
      shiftFvec(in_stack_000002e0);
      pnVar7 = &this->theShift;
      entertol(in_stack_fffffffffffffcf8);
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_39,pnVar7,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&stack0xfffffffffffffde0);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffce0);
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffce0,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 (cpp_dec_float<100U,_int,_void> *)0x4d793a);
      local_a0 = &this->lastShift;
      local_a8 = &stack0xfffffffffffffe30;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffce0,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      computeCoTest((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_ffffffffffffff90._M_pi);
      computeTest(in_stack_ffffffffffffffa0);
    }
    else {
      shiftPvec(in_stack_00000400);
      this_00 = &(this->theShift).m_backend;
      leavetol(in_stack_fffffffffffffcf8);
      local_78 = &local_2c0;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_79,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)this_00,
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_78);
      pSVar6 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&stack0xfffffffffffffd90;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00);
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (this_00,(cpp_dec_float<100U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                 (cpp_dec_float<100U,_int,_void> *)0x4d7a63);
      local_b0 = &this->lastShift;
      local_b8 = &stack0xfffffffffffffd90;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (this_00,(cpp_dec_float<100U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      computeFtest(pSVar6);
    }
    pSVar6 = this;
    if ((this->initialized & 1U) == 0) {
      (*this->thepricer->_vptr_SPxPricer[1])();
      (*this->theratiotester->_vptr_SPxRatioTester[1])();
      this->initialized = true;
    }
  }
  return (int)pSVar6;
}

Assistant:

void SPxSolverBase<R>::init()
   {

      assert(thepricer      != nullptr);
      assert(theratiotester != nullptr);

      if(!initialized)
      {
         initialized = true;
         clearUpdateVecs();
         reDim();

         if(SPxBasisBase<R>::status() <= SPxBasisBase<R>::NO_PROBLEM || this->solver() != this)
            SPxBasisBase<R>::load(this);

         initialized = false;
      }

      if(!this->matrixIsSetup)
         SPxBasisBase<R>::loadDesc(this->desc());

      // Inna/Tobi: don't "upgrade" a singular basis to a regular one
      if(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR)
         return;

      // catch pathological case for LPs with zero constraints
      if(dim() == 0)
      {
         this->factorized = true;
      }

      // we better factorize explicitly before solving
      if(!this->factorized)
      {
         try
         {
            SPxBasisBase<R>::factorize();
         }
         catch(const SPxException&)
         {
            // reload inital slack basis in case the factorization failed
            assert(SPxBasisBase<R>::status() <= SPxBasisBase<R>::SINGULAR);
            SPxBasisBase<R>::restoreInitialBasis();
            SPxBasisBase<R>::factorize();
            assert(this->factorized);
         }
      }

      m_numCycle = 0;

      if(type() == ENTER)
      {
         if(rep() == COLUMN)
         {
            setPrimalBounds();
            setBasisStatus(SPxBasisBase<R>::PRIMAL);
         }
         else
         {
            setDualRowBounds();
            setBasisStatus(SPxBasisBase<R>::DUAL);
         }

         setEnterBounds();
         computeEnterCoPrhs();
         // prepare support vectors for sparse pricing
         infeasibilities.setMax(dim());
         infeasibilitiesCo.setMax(coDim());
         isInfeasible.reSize(dim());
         isInfeasibleCo.reSize(coDim());
         theratiotester->setDelta(entertol());
      }
      else
      {
         if(rep() == ROW)
         {
            setPrimalBounds();
            setBasisStatus(SPxBasisBase<R>::PRIMAL);
         }
         else
         {
            setDualColBounds();
            setBasisStatus(SPxBasisBase<R>::DUAL);
         }

         setLeaveBounds();
         computeLeaveCoPrhs();
         // prepare support vectors for sparse pricing
         infeasibilities.setMax(dim());
         isInfeasible.reSize(dim());
         theratiotester->setDelta(leavetol());
      }

      SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
      computePvec();
      computeFrhs();
      SPxBasisBase<R>::solve(*theFvec, *theFrhs);

      theShift = 0.0;

      if(type() == ENTER)
      {
         shiftFvec();
         lastShift = theShift + entertol();

         computeCoTest();
         computeTest();
      }
      else
      {
         shiftPvec();
         lastShift = theShift + leavetol();

         computeFtest();
      }

      if(!initialized)
      {
         // if(thepricer->solver() != this)
         thepricer->load(this);
         // if(theratiotester->solver() != this)
         theratiotester->load(this);
         initialized = true;
      }
   }